

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralConnection::~IfcStructuralConnection
          (IfcStructuralConnection *this)

{
  *(undefined8 *)this = 0x7f7838;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralConnection,_1UL>).field_0x20 =
       0x7f78b0;
  *(undefined8 *)&this->field_0x88 = 0x7f7860;
  *(undefined8 *)&this->field_0x98 = 0x7f7888;
  if (*(undefined1 **)&this->field_0xa8 != &this->field_0xb8) {
    operator_delete(*(undefined1 **)&this->field_0xa8,*(long *)&this->field_0xb8 + 1);
  }
  *(undefined8 *)this = 0x7f7950;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralConnection,_1UL>).field_0x20 =
       0x7f7978;
  if (*(undefined1 **)&this->field_0x60 != &this->field_0x70) {
    operator_delete(*(undefined1 **)&this->field_0x60,*(long *)&this->field_0x70 + 1);
  }
  if (*(undefined1 **)&this->field_0x38 != &this->field_0x48) {
    operator_delete(*(undefined1 **)&this->field_0x38,*(long *)&this->field_0x48 + 1);
  }
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10,*(long *)&this->field_0x20 + 1);
  }
  operator_delete(this,0x148);
  return;
}

Assistant:

IfcStructuralConnection() : Object("IfcStructuralConnection") {}